

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::doPendingFuntors(EventLoop *this)

{
  pointer pfVar1;
  iterator __end1;
  iterator __begin1;
  pointer this_00;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_40;
  
  this->callingPendingFunctors_ = true;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  this_00 = (this->pendingFuntors_).
            super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pfVar1 = (this->pendingFuntors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_40.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->pendingFuntors_).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->pendingFuntors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pendingFuntors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pendingFuntors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = this_00;
  local_40.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pfVar1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  for (; this_00 != pfVar1; this_00 = this_00 + 1) {
    std::function<void_()>::operator()(this_00);
  }
  this->callingPendingFunctors_ = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_40);
  return;
}

Assistant:

void EventLoop::doPendingFuntors() {
    std::vector<Functor> functors;
    callingPendingFunctors_ = true;
    
    {
        MutexLockGuard lock(mutex_);
        functors.swap(pendingFuntors_);
    }

    for(const Functor& functor : functors) {
        functor();
    }

    callingPendingFunctors_ = false;
}